

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O2

void vkt::ssbo::anon_unknown_15::generateWriteSrc
               (ostream *src,BufferLayout *bufferLayout,BufferBlock *block,int instanceNdx,
               BlockDataPtr *blockPtr,BufferVar *bufVar,SubTypeAccess *accessPath)

{
  int iVar1;
  ostream *poVar2;
  TypeComponentVector *var;
  BlockDataPtr *accessPath_00;
  BufferVar *accessPath_01;
  int iVar3;
  BufferVarLayoutEntry *varLayout;
  void *pvVar4;
  VarType curType;
  string apiName;
  string shaderName;
  
  accessPath_00 = blockPtr;
  accessPath_01 = bufVar;
  glu::SubTypeAccess::getType(&curType,accessPath);
  if (curType.m_type == TYPE_STRUCT) {
    iVar1 = 0;
    iVar3 = (int)((*(long *)(CONCAT44(curType.m_data.basic.precision,curType.m_data.basic.type) +
                            0x28) -
                  *(long *)(CONCAT44(curType.m_data.basic.precision,curType.m_data.basic.type) +
                           0x20)) / 0x38);
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != iVar1; iVar1 = iVar1 + 1) {
      glu::SubTypeAccess::member((SubTypeAccess *)&apiName,accessPath,iVar1);
      generateWriteSrc(src,bufferLayout,block,instanceNdx,blockPtr,bufVar,(SubTypeAccess *)&apiName)
      ;
      glu::SubTypeAccess::~SubTypeAccess((SubTypeAccess *)&apiName);
    }
  }
  else if (curType.m_type == TYPE_ARRAY) {
    if (curType.m_data.array.size == -1) {
      curType.m_data.array.size =
           (block->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[instanceNdx];
    }
    iVar3 = 0;
    iVar1 = curType.m_data.array.size;
    if (curType.m_data.array.size < 1) {
      iVar1 = 0;
    }
    for (; iVar1 != iVar3; iVar3 = iVar3 + 1) {
      glu::SubTypeAccess::element((SubTypeAccess *)&apiName,accessPath,iVar3);
      generateWriteSrc(src,bufferLayout,block,instanceNdx,blockPtr,bufVar,(SubTypeAccess *)&apiName)
      ;
      glu::SubTypeAccess::~SubTypeAccess((SubTypeAccess *)&apiName);
    }
  }
  else {
    var = &accessPath->m_path;
    ssbo::(anonymous_namespace)::getAPIName_abi_cxx11_
              (&apiName,(_anonymous_namespace_ *)block,(BufferBlock *)bufVar,(BufferVar *)var,
               (TypeComponentVector *)accessPath_00);
    iVar1 = BufferLayout::getVariableIndex(bufferLayout,&apiName);
    varLayout = (bufferLayout->bufferVars).
                super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar1;
    ssbo::(anonymous_namespace)::getShaderName_abi_cxx11_
              (&shaderName,(_anonymous_namespace_ *)block,(BufferBlock *)(ulong)(uint)instanceNdx,
               (int)bufVar,(BufferVar *)var,(TypeComponentVector *)accessPath_01);
    pvVar4 = blockPtr->ptr;
    iVar1 = computeOffset(varLayout,var);
    poVar2 = std::operator<<(src,"\t");
    poVar2 = std::operator<<(poVar2,(string *)&shaderName);
    std::operator<<(poVar2," = ");
    pvVar4 = (void *)((long)pvVar4 + (long)iVar1);
    if (curType.m_data.basic.type - TYPE_FLOAT_MAT2 < 9 ||
        curType.m_data.basic.type - TYPE_DOUBLE_MAT2 < 9) {
      generateImmMatrixSrc
                (src,curType.m_data.basic.type,varLayout->matrixStride,varLayout->isRowMajor,pvVar4)
      ;
    }
    else {
      generateImmScalarVectorSrc(src,curType.m_data.basic.type,pvVar4);
    }
    std::operator<<(src,";\n");
    std::__cxx11::string::~string((string *)&shaderName);
    std::__cxx11::string::~string((string *)&apiName);
  }
  glu::VarType::~VarType(&curType);
  return;
}

Assistant:

void generateWriteSrc (
	std::ostream&				src,
	const BufferLayout&			bufferLayout,
	const BufferBlock&			block,
	int							instanceNdx,
	const BlockDataPtr&			blockPtr,
	const BufferVar&			bufVar,
	const glu::SubTypeAccess&	accessPath)
{
	const VarType curType = accessPath.getType();

	if (curType.isArrayType())
	{
		const int arraySize = curType.getArraySize() == VarType::UNSIZED_ARRAY ? block.getLastUnsizedArraySize(instanceNdx) : curType.getArraySize();

		for (int elemNdx = 0; elemNdx < arraySize; elemNdx++)
			generateWriteSrc(src, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.element(elemNdx));
	}
	else if (curType.isStructType())
	{
		const int numMembers = curType.getStructPtr()->getNumMembers();

		for (int memberNdx = 0; memberNdx < numMembers; memberNdx++)
			generateWriteSrc(src, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.member(memberNdx));
	}
	else
	{
		DE_ASSERT(curType.isBasicType());

		const string	apiName	= getAPIName(block, bufVar, accessPath.getPath());
		const int		varNdx	= bufferLayout.getVariableIndex(apiName);

		DE_ASSERT(varNdx >= 0);
		{
			const BufferVarLayoutEntry&	varLayout		= bufferLayout.bufferVars[varNdx];
			const string				shaderName		= getShaderName(block, instanceNdx, bufVar, accessPath.getPath());
			const glu::DataType			basicType		= curType.getBasicType();
			const bool					isMatrix		= glu::isDataTypeMatrix(basicType);
			const void*					valuePtr		= (const deUint8*)blockPtr.ptr + computeOffset(varLayout, accessPath.getPath());

			src << "\t" << shaderName << " = ";

			if (isMatrix)
				generateImmMatrixSrc(src, basicType, varLayout.matrixStride, varLayout.isRowMajor, valuePtr);
			else
				generateImmScalarVectorSrc(src, basicType, valuePtr);

			src << ";\n";
		}
	}
}